

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
pstore::json::parser<json_out_callbacks>::parser
          (parser<json_out_callbacks> *this,json_out_callbacks *callbacks,extensions extensions)

{
  stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  _Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false> _Var5;
  error_category *peVar6;
  pointer *__ptr;
  unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  local_40;
  
  _Var5._M_head_impl = (singleton_storage<json_out_callbacks> *)operator_new(0x68);
  (this->singletons_)._M_t.
  super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  this_00 = &this->stack_;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->stack_).c.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                       *)this_00,0);
  (this->error_)._M_value = 0;
  peVar6 = (error_category *)std::_V2::system_category();
  (this->error_)._M_cat = peVar6;
  paVar1 = &(this->callbacks_).out_.field_2;
  (this->callbacks_).out_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (callbacks->out_)._M_dataplus._M_p;
  paVar2 = &(callbacks->out_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(callbacks->out_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->callbacks_).out_.field_2 + 8) = uVar4;
  }
  else {
    (this->callbacks_).out_._M_dataplus._M_p = pcVar3;
    (this->callbacks_).out_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->callbacks_).out_._M_string_length = (callbacks->out_)._M_string_length;
  (callbacks->out_)._M_dataplus._M_p = (pointer)paVar2;
  (callbacks->out_)._M_string_length = 0;
  (callbacks->out_).field_2._M_local_buf[0] = '\0';
  this->extensions_ = extensions;
  (this->string_)._M_dataplus._M_p = (pointer)&(this->string_).field_2;
  (this->string_)._M_string_length = 0;
  (this->string_).field_2._M_local_buf[0] = '\0';
  (this->coordinate_).column = 1;
  (this->coordinate_).row = 1;
  local_40._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       (matcher<json_out_callbacks> *)
       (this->singletons_)._M_t.
       super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
       ._M_head_impl;
  *(undefined4 *)
   ((long)(((singleton_storage<json_out_callbacks> *)
           local_40._M_t.
           super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
           .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
           _M_head_impl)->eof).__data + 8) = 2;
  *(undefined ***)
   &((singleton_storage<json_out_callbacks> *)
    local_40._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
    .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl
    )->eof = &PTR__matcher_001bec80;
  local_40._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
  ._M_head_impl.delete_ =
       (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
        )(deleter<pstore::json::details::matcher<json_out_callbacks>_>)0x0;
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>>
  ::
  emplace_back<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>
            ((deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>>
              *)this_00,&local_40);
  if ((singleton_storage<json_out_callbacks> *)
      local_40._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
      _M_head_impl != (singleton_storage<json_out_callbacks> *)0x0) {
    (**(code **)((long)((type *)&(local_40._M_t.
                                  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                                  .
                                  super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>
                                 ._M_head_impl)->_vptr_matcher)->__align +
                (ulong)(byte)local_40._M_t.
                             super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             .
                             super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             .
                             super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
                             ._M_head_impl.delete_ * 8))();
  }
  _Var5._M_head_impl =
       (this->singletons_)._M_t.
       super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
       ._M_head_impl;
  local_40._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       (matcher<json_out_callbacks> *)&(_Var5._M_head_impl)->trailing_ws;
  *(undefined4 *)((long)((_Var5._M_head_impl)->trailing_ws).__data + 8) = 2;
  ((_Var5._M_head_impl)->trailing_ws).__align =
       (anon_struct_8_0_00000001_for___align)&PTR__matcher_001becf8;
  local_40._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
  ._M_head_impl.delete_ =
       (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
        )(deleter<pstore::json::details::matcher<json_out_callbacks>_>)0x0;
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>>
  ::
  emplace_back<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>
            ((deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>>
              *)this_00,&local_40);
  if (local_40._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
      _M_head_impl != (matcher<json_out_callbacks> *)0x0) {
    (**(code **)((long)((type *)&(local_40._M_t.
                                  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                                  .
                                  super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>
                                 ._M_head_impl)->_vptr_matcher)->__align +
                (ulong)(byte)local_40._M_t.
                             super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             .
                             super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             .
                             super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
                             ._M_head_impl.delete_ * 8))();
  }
  _Var5._M_head_impl =
       (this->singletons_)._M_t.
       super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
       ._M_head_impl;
  local_40._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>._M_head_impl =
       (matcher<json_out_callbacks> *)&(_Var5._M_head_impl)->root;
  *(undefined4 *)((long)((_Var5._M_head_impl)->root).__data + 8) = 2;
  ((_Var5._M_head_impl)->root).__align =
       (anon_struct_8_0_00000001_for___align)&PTR__matcher_001bed38;
  *(undefined1 *)((long)((_Var5._M_head_impl)->root).__data + 0xc) = 0;
  local_40._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
  .
  super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
  ._M_head_impl.delete_ =
       (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
        )(deleter<pstore::json::details::matcher<json_out_callbacks>_>)0x0;
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>>
  ::
  emplace_back<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>
            ((deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>>>>>
              *)this_00,&local_40);
  if (local_40._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
      _M_head_impl != (matcher<json_out_callbacks> *)0x0) {
    (**(code **)((long)((type *)&(local_40._M_t.
                                  super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                                  .
                                  super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>
                                 ._M_head_impl)->_vptr_matcher)->__align +
                (ulong)(byte)local_40._M_t.
                             super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             .
                             super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                             .
                             super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>,_false>
                             ._M_head_impl.delete_ * 8))();
  }
  return;
}

Assistant:

parser<Callbacks>::parser (Callbacks callbacks, extensions const extensions)
                : callbacks_ (std::move (callbacks))
                , extensions_{extensions} {

            using mpointer = typename matcher::pointer;
            using deleter = typename mpointer::deleter_type;
            // The EOF matcher is placed at the bottom of the stack to ensure that the input JSON
            // ends after a single top-level object.
            stack_.push (mpointer (new (&singletons_->eof) details::eof_matcher<Callbacks>{},
                                   deleter{false}));
            // We permit whitespace after the top-level object.
            stack_.push (mpointer (new (&singletons_->trailing_ws)
                                       details::whitespace_matcher<Callbacks>{},
                                   deleter{false}));
            stack_.push (this->make_root_matcher ());
        }